

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<long,char,unsigned_long>
          (String *__return_storage_ptr__,kj *this,long *params,char *params_1,
          unsigned_long *params_2)

{
  long *value;
  char *value_00;
  unsigned_long *value_01;
  CappedArray<char,_26UL> local_80;
  char local_51 [1];
  CappedArray<char,_26UL> local_50;
  NoInfer<unsigned_long> *local_28;
  unsigned_long *params_local_2;
  char *params_local_1;
  long *params_local;
  
  local_28 = (NoInfer<unsigned_long> *)params_1;
  params_local_2 = (unsigned_long *)params;
  params_local_1 = (char *)this;
  params_local = (long *)__return_storage_ptr__;
  value = fwd<long>((NoInfer<long> *)this);
  toCharSequence<long>(&local_50,value);
  value_00 = fwd<char>((NoInfer<char> *)params_local_2);
  local_51[0] = (char)toCharSequence<char>(value_00);
  value_01 = fwd<unsigned_long>(local_28);
  toCharSequence<unsigned_long>(&local_80,value_01);
  _::concat<kj::CappedArray<char,26ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_50,(CappedArray<char,_26UL> *)local_51,
             (FixedArray<char,_1UL> *)&local_80,(CappedArray<char,_26UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}